

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void prvTidyInsertNodeAtEnd(Node *element,Node *node)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  node->parent = element;
  if (element == (Node *)0x0) {
    node->prev = (Node *)0x0;
  }
  else {
    pNVar1 = element->last;
    node->prev = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      ppNVar2 = &pNVar1->next;
      goto LAB_0013991f;
    }
  }
  if (element == (Node *)0x0) {
    return;
  }
  ppNVar2 = &element->content;
LAB_0013991f:
  *ppNVar2 = node;
  if (element != (Node *)0x0) {
    element->last = node;
  }
  return;
}

Assistant:

void TY_(InsertNodeAtEnd)(Node *element, Node *node)
{
    node->parent = element;
    node->prev = element ? element->last : NULL;

    if (element && element->last != NULL)
        element->last->next = node;
    else
        if (element)
            element->content = node;

    if (element)
        element->last = node;
}